

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O3

void initialize_worker_for_sim<PredictionData<float,long>>
               (WorkerForSimilarity *workspace,PredictionData<float,_long> *prediction_data,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,size_t n_from,
               bool assume_full_distr)

{
  pointer puVar1;
  pointer puVar2;
  pointer pdVar3;
  pointer pdVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  ulong uVar9;
  vector<double,_std::allocator<double>_> *this;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  value_type_conflict local_30;
  long lVar14;
  
  workspace->st = 0;
  sVar8 = prediction_data->nrows;
  workspace->end = sVar8 - 1;
  workspace->n_from = n_from;
  workspace->assume_full_distr = assume_full_distr;
  if ((workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&workspace->ix_arr,sVar8);
    auVar5 = _DAT_0036e1f0;
    puVar1 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      uVar6 = (long)puVar2 + (-8 - (long)puVar1);
      auVar16._8_4_ = (int)uVar6;
      auVar16._0_8_ = uVar6;
      auVar16._12_4_ = (int)(uVar6 >> 0x20);
      auVar10._0_8_ = uVar6 >> 3;
      auVar10._8_8_ = auVar16._8_8_ >> 3;
      uVar7 = 0;
      auVar10 = auVar10 ^ _DAT_0036e1f0;
      auVar13 = _DAT_0036e1e0;
      do {
        auVar16 = auVar13 ^ auVar5;
        if ((bool)(~(auVar16._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar16._0_4_ ||
                    auVar10._4_4_ < auVar16._4_4_) & 1)) {
          puVar1[uVar7] = uVar7;
        }
        if ((auVar16._12_4_ != auVar10._12_4_ || auVar16._8_4_ <= auVar10._8_4_) &&
            auVar16._12_4_ <= auVar10._12_4_) {
          puVar1[uVar7 + 1] = uVar7 + 1;
        }
        uVar7 = uVar7 + 2;
        lVar14 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar14 + 2;
      } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
    }
    uVar6 = prediction_data->nrows;
    if (n_from == 0) {
      this = &workspace->tmat_sep;
      if ((uVar6 & 1) == 0) {
        uVar9 = uVar6 - 1;
        uVar7 = uVar6;
      }
      else {
        uVar7 = uVar6 - 1;
        uVar9 = uVar6;
      }
      sVar8 = uVar9 * (uVar7 >> 1);
    }
    else {
      this = &workspace->rmat;
      sVar8 = (uVar6 - n_from) * n_from;
    }
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize(this,sVar8,&local_30);
  }
  auVar13 = _DAT_0036e1f0;
  auVar5 = _DAT_0036e1e0;
  if ((model_outputs != (IsoForest *)0x0) &&
     ((model_outputs->missing_action == Divide ||
      (((model_outputs->new_cat_action == Weighted && (model_outputs->cat_split_type == SubSet)) &&
       (prediction_data->categ_data != (int *)0x0)))))) {
    pdVar3 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 == pdVar4) {
      local_30 = 1.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&workspace->weights_arr,prediction_data->nrows,&local_30);
    }
    else {
      uVar6 = (long)pdVar4 + (-8 - (long)pdVar3);
      auVar11._8_4_ = (int)uVar6;
      auVar11._0_8_ = uVar6;
      auVar11._12_4_ = (int)(uVar6 >> 0x20);
      auVar12._0_8_ = uVar6 >> 3;
      auVar12._8_8_ = auVar11._8_8_ >> 3;
      uVar7 = 0;
      auVar12 = auVar12 ^ _DAT_0036e1f0;
      do {
        auVar15._8_4_ = (int)uVar7;
        auVar15._0_8_ = uVar7;
        auVar15._12_4_ = (int)(uVar7 >> 0x20);
        auVar16 = (auVar15 | auVar5) ^ auVar13;
        if ((bool)(~(auVar16._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar16._0_4_ ||
                    auVar12._4_4_ < auVar16._4_4_) & 1)) {
          pdVar3[uVar7] = 1.0;
        }
        if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
            auVar16._12_4_ <= auVar12._12_4_) {
          pdVar3[uVar7 + 1] = 1.0;
        }
        uVar7 = uVar7 + 2;
      } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
    }
  }
  if (model_outputs_ext != (ExtIsoForest *)0x0) {
    pdVar3 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 == pdVar4) {
      local_30 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&workspace->comb_val,prediction_data->nrows,&local_30);
    }
    else {
      memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
    }
  }
  return;
}

Assistant:

void initialize_worker_for_sim(WorkerForSimilarity  &workspace,
                               PredictionData       &prediction_data,
                               IsoForest            *model_outputs,
                               ExtIsoForest         *model_outputs_ext,
                               size_t                n_from,
                               bool                  assume_full_distr)
{
    workspace.st  = 0;
    workspace.end = prediction_data.nrows - 1;
    workspace.n_from = n_from;
    workspace.assume_full_distr = assume_full_distr; /* doesn't need to have one copy per worker */

    if (workspace.ix_arr.empty())
    {
        workspace.ix_arr.resize(prediction_data.nrows);
        std::iota(workspace.ix_arr.begin(), workspace.ix_arr.end(), (size_t)0);
        if (!n_from)
            workspace.tmat_sep.resize(calc_ncomb(prediction_data.nrows), 0);
        else
            workspace.rmat.resize((prediction_data.nrows - n_from) * n_from, 0);
    }

    if (model_outputs != NULL &&
        (model_outputs->missing_action == Divide ||
         (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && prediction_data.categ_data != NULL)))
    {
        if (workspace.weights_arr.empty())
            workspace.weights_arr.resize(prediction_data.nrows, 1.);
        else
            std::fill(workspace.weights_arr.begin(), workspace.weights_arr.end(), 1.);
    }

    if (model_outputs_ext != NULL)
    {
        if (workspace.comb_val.empty())
            workspace.comb_val.resize(prediction_data.nrows, 0);
        else
            std::fill(workspace.comb_val.begin(), workspace.comb_val.end(), 0);
    }
}